

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O2

int ON__isnand(double *x)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  if (ON__isnand(double_const*)::b6 == '\x01') {
    lVar3 = 7;
    if (ON__isnand(double_const*)::b7 == '\0') {
      lVar3 = 0;
    }
  }
  else {
    ON__isnand(double_const*)::b7 = '\x01';
    ON__isnand(double_const*)::b6 = '\x01';
    lVar3 = 7;
  }
  iVar2 = 0;
  if (((~*(byte *)((long)x + lVar3) & 0x7f) == 0) &&
     (bVar1 = *(byte *)((long)x + 6), (~bVar1 & 0xf0) == 0)) {
    if ((bVar1 & 8) != 0) {
      return 2;
    }
    iVar2 = 1;
    if (((((bVar1 & 7) == 0) && (*(char *)x == '\0')) && (*(char *)((long)x + 1) == '\0')) &&
       (((*(char *)((long)x + 2) == '\0' && (*(char *)((long)x + 3) == '\0')) &&
        (*(char *)((long)x + 4) == '\0')))) {
      return (int)(*(char *)((long)x + 5) != '\0');
    }
  }
  return iVar2;
}

Assistant:

static int ON__isnand(const double* x)
{
  const unsigned char* b = (const unsigned char*)x;
  static unsigned int b7 = 0;
  static unsigned int b6 = 0;
  if (0 == b6)
  {
    // different bytes on
    union
    {
      double x;
      unsigned char b[8];
    } u;  u.x = 2.0; // sign = 0; fraction = 0; exponent = 100 0000 0000 binary

    if (0x40 == u.b[7] && 0 == u.b[0]
      && 0 == u.b[1] && 0 == u.b[2] && 0 == u.b[3]
      && 0 == u.b[4] && 0 == u.b[5] && 0 == u.b[6]
      )
    {
      // little endian doubles
      b7 = 7;
      b6 = 6;
    }
    else if (0x40 == u.b[0] && 0 == u.b[7]
      && 0 == u.b[1] && 0 == u.b[2] && 0 == u.b[3]
      && 0 == u.b[4] && 0 == u.b[5] && 0 == u.b[6]
      )
    {
      // big endian doubles
      b7 = 0;
      b6 = 1;
    }
    else
    {
      // This situation is not handled by this algorithm
      // and that is a bug in the algorithm.
      ON_ERROR("Unexpected bit pattern in double 2.0.");
      // assume little endian doubles
      b7 = 7;
      b6 = 6;
    }
  }

  if (0x7F == (0x7F & b[b7]) && (0xF0 == (0xF0 & b[b6])))
  {
    // All exponent bits are set
    if (0x08 & b[b6])
    {
      // The most significant fraction bit is set.
      // This must be a QNaN
      return 2;
    }
    else
    {
      // The most significant fraction bit is is clear.  
      // If any other fraction bits are set, it's an SNaN
      if (0 != (0x0F & b[b6]))
        return 1;
      if (6 == b6)
      {
        // little endian
        return
          (0 != b[0] || 0 != b[1] || 0 != b[2] || 0 != b[3] || 0 != b[4] || 0 != b[5])
          ? 1  // some fraction bit is set
          : 0; // all fraction bits are clear.
      }
      else
      {
        // big endian
        return
          (0 != b[2] || 0 != b[3] || 0 != b[4] || 0 != b[5] || 0 != b[6] || 0 != b[7])
          ? 1  // some fraction bit is set
          : 0; // all fraction bits are clear.
      }
    }
  }

  return 0; // not a NaN
}